

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffupck(fitsfile *fptr,int *status)

{
  int iVar1;
  int iVar2;
  LONGLONG *dataend_00;
  int *in_RSI;
  char *in_RDI;
  int *status_00;
  double tdouble;
  unsigned_long dsum;
  unsigned_long sum;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  long nrec;
  int tstatus;
  char datasum [71];
  char checksum [71];
  char comm [73];
  char chkcomm [73];
  char datestr [20];
  int *in_stack_000009b0;
  unsigned_long *in_stack_000009b8;
  long in_stack_000009c0;
  fitsfile *in_stack_000009c8;
  LONGLONG *in_stack_fffffffffffffe58;
  int err_mode;
  LONGLONG *pLVar3;
  LONGLONG *in_stack_fffffffffffffe60;
  fitsfile *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  fitsfile *in_stack_fffffffffffffea8;
  char local_128 [16];
  int *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  unsigned_long in_stack_ffffffffffffff10;
  char local_88 [8];
  int *in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  char local_38 [32];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RSI < 1) {
    ffgstm((char *)in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
           (int *)in_stack_fffffffffffffe58);
    strcpy(local_88,"HDU checksum updated ");
    strcat(local_88,local_38);
    iVar1 = ffgkys(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if (iVar1 == 0xca) {
      ffpmsg((char *)0x138228);
      iVar1 = *in_RSI;
    }
    else {
      status_00 = (int *)atof(&stack0xfffffffffffffe88);
      dataend_00 = (LONGLONG *)
                   ((long)(double)status_00 |
                   (long)((double)status_00 - 9.223372036854776e+18) &
                   (long)(double)status_00 >> 0x3f);
      iVar1 = ffghadll(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
                       ,dataend_00,status_00);
      err_mode = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      if (iVar1 < 1) {
        iVar1 = *in_RSI;
        iVar2 = ffgkys(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                       ,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        if (iVar2 == 0xca) {
          *in_RSI = iVar1;
          strcpy(local_128,"0000000000000000");
          ffpkys((fitsfile *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
        }
        else {
          iVar1 = ffwend(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          if (0 < iVar1) {
            return *in_RSI;
          }
          ffmbyt(in_stack_fffffffffffffe68,(LONGLONG)in_stack_fffffffffffffe60,err_mode,
                 (int *)dataend_00);
          pLVar3 = dataend_00;
          iVar1 = ffcsum(in_stack_000009c8,in_stack_000009c0,in_stack_000009b8,in_stack_000009b0);
          if (0 < iVar1) {
            return *in_RSI;
          }
          if ((pLVar3 == (LONGLONG *)0x0) || (pLVar3 == (LONGLONG *)0xffffffff)) {
            return *in_RSI;
          }
          ffmkys((fitsfile *)dsum,(char *)tdouble,
                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
                );
          err_mode = (int)((ulong)pLVar3 >> 0x20);
        }
        ffmbyt(in_stack_fffffffffffffe68,(LONGLONG)in_stack_fffffffffffffe60,err_mode,
               (int *)dataend_00);
        iVar1 = ffcsum(in_stack_000009c8,in_stack_000009c0,in_stack_000009b8,in_stack_000009b0);
        if (iVar1 < 1) {
          ffesum(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
          ffmkys((fitsfile *)dsum,(char *)tdouble,
                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
                );
          iVar1 = *in_RSI;
        }
        else {
          iVar1 = *in_RSI;
        }
      }
      else {
        iVar1 = *in_RSI;
      }
    }
  }
  else {
    iVar1 = *in_RSI;
  }
  return iVar1;
}

Assistant:

int ffupck(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Update the CHECKSUM keyword value.  This assumes that the DATASUM
   keyword exists and has the correct value.
*/
{
    char datestr[20], chkcomm[FLEN_COMMENT], comm[FLEN_COMMENT];
    char checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long sum, dsum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);

    /* get the DATASUM keyword and convert it to a unsigned long */
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        ffpmsg("DATASUM keyword not found (ffupck");
        return(*status);
    }

    tdouble = atof(datasum); /* read as a double as a workaround */
    dsum = (unsigned long) tdouble;

    /* get size of the HDU */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    /* get the checksum keyword, if it exists */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }
    else
    {
        /* check if CHECKSUM is still OK */
        /* rewrite END keyword and following blank fill */
        if (ffwend(fptr, status) > 0)
            return(*status);

        /* move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);    /* CHECKSUM is already correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}